

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  char *pcVar11;
  pointer pbVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  pointer pbVar13;
  mapped_type *this_00;
  long lVar14;
  pointer piVar15;
  int iVar16;
  ulong uVar17;
  string *t;
  pointer pbVar18;
  string *psVar19;
  int retVal;
  string *local_a08;
  int local_9fc;
  string lcovFile;
  string nl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string daGlob;
  string dir;
  string errors;
  string lineNumber;
  string srcname;
  string sourceFile;
  string fileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  covargs;
  string actualSourceFile;
  string lcovCommand;
  ostringstream cmCTestLog_msg;
  byte abStack_7b8 [488];
  string command;
  string lcovExtraFlags;
  cmWorkingDirectory workdir;
  ostringstream cmCTestLog_msg_15;
  byte abStack_548 [488];
  string st2lcovOutputRex3;
  cmCTestCoverageHandlerLocale locale_C;
  string testingDir;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  ostringstream cmCTestLog_msg_21;
  RegularExpression st2re3;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CoverageCommand",(allocator<char> *)&cmCTestLog_msg_15);
  cmCTest::GetCTestConfiguration(&lcovCommand,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CoverageExtraFlags",(allocator<char> *)&cmCTestLog_msg_15);
  cmCTest::GetCTestConfiguration(&lcovExtraFlags,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  bVar6 = std::operator!=(&lcovCommand,"codecov");
  if (bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg," Not a valid Intel Coverage command.");
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x540,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar16 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&st2lcovOutputRex3,"[0-9]+%",(allocator<char> *)&cmCTestLog_msg);
    cmsys::RegularExpression::RegularExpression(&st2re3,st2lcovOutputRex3._M_dataplus._M_p);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg," This is coverage command: ");
    poVar10 = std::operator<<(poVar10,(string *)&lcovCommand);
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x549,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg," These are coverage command flags: ");
    poVar10 = std::operator<<(poVar10,(string *)&lcovExtraFlags);
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x54e,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar6 = FindLCovFiles(this,&files);
    if (bVar6) {
      if (files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCTestLog_msg," Cannot find any LCov coverage files."
                                 );
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x55a,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        iVar16 = 0;
      }
      else {
        cmCTest::GetBinaryDir_abi_cxx11_(&testingDir,(this->super_cmCTestGenericHandler).CTest);
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &missingFiles._M_t._M_impl.super__Rb_tree_header._M_header;
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        actualSourceFile._M_dataplus._M_p = (pointer)&actualSourceFile.field_2;
        actualSourceFile._M_string_length = 0;
        actualSourceFile.field_2._M_local_buf[0] = '\0';
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,
                                  "   Processing coverage (each . represents one file):");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x566,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"    ");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x567,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&locale_C);
        cmSystemTools::ParseArguments(&covargs,&lcovExtraFlags);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&covargs,(const_iterator)
                          covargs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,&lcovCommand);
        joinCommandLine(&command,&covargs);
        pbVar3 = files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar16 = 0;
        for (psVar19 = files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar19 != pbVar3;
            psVar19 = psVar19 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::operator<<((ostream *)&cmCTestLog_msg,".");
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x577,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          cmsys::SystemTools::GetFilenamePath(&fileDir,psVar19);
          cmWorkingDirectory::cmWorkingDirectory(&workdir,&fileDir);
          if (workdir.ResultCode == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Current coverage dir: ");
            poVar10 = std::operator<<(poVar10,(string *)&fileDir);
            std::endl<char,std::char_traits<char>>(poVar10);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x585,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&command);
            std::endl<char,std::char_traits<char>>(poVar10);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x587,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
            local_a08 = psVar19;
            std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            output._M_dataplus._M_p = (pointer)&output.field_2;
            output._M_string_length = 0;
            output.field_2._M_local_buf[0] = '\0';
            errors._M_dataplus._M_p = (pointer)&errors.field_2;
            errors._M_string_length = 0;
            errors.field_2._M_local_buf[0] = '\0';
            retVal = 0;
            poVar10 = std::operator<<(cont->OFS,"* Run coverage for: ");
            poVar10 = std::operator<<(poVar10,(string *)&fileDir);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::operator<<(cont->OFS,"  Command: ");
            poVar10 = std::operator<<(poVar10,(string *)&command);
            std::endl<char,std::char_traits<char>>(poVar10);
            bVar6 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,&covargs,&output,
                                        &errors,&retVal,fileDir._M_dataplus._M_p,(cmDuration)0x0,
                                        Auto);
            poVar10 = std::operator<<(cont->OFS,"  Output: ");
            poVar10 = std::operator<<(poVar10,(string *)&output);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::operator<<(cont->OFS,"  Errors: ");
            poVar10 = std::operator<<(poVar10,(string *)&errors);
            std::endl<char,std::char_traits<char>>(poVar10);
            psVar19 = local_a08;
            if (bVar6) {
              if (retVal != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Coverage command returned: ");
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,retVal);
                poVar10 = std::operator<<(poVar10," while processing: ");
                poVar10 = std::operator<<(poVar10,(string *)psVar19);
                std::endl<char,std::char_traits<char>>(poVar10);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x59f,_cmCTestLog_msg_15,false);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Command produced error: ");
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,cont->Error);
                std::endl<char,std::char_traits<char>>(poVar10);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5a1,_cmCTestLog_msg_15,false);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,
                                        "--------------------------------------------------------------"
                                       );
              poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::operator<<(poVar10,(string *)&output);
              poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::operator<<(poVar10,
                                        "--------------------------------------------------------------"
                                       );
              std::endl<char,std::char_traits<char>>(poVar10);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x5aa,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmsys::SystemTools::Split(&output,&lines);
              pbVar4 = lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pbVar12 = lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (pbVar12 == pbVar4) {
                  iVar16 = iVar16 + 1;
                  iVar8 = 0;
                  if (iVar16 % 0x32 == 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg," processed: ");
                    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar16);
                    poVar10 = std::operator<<(poVar10," out of ");
                    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                    std::endl<char,std::char_traits<char>>(poVar10);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x631,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet
                                );
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                    std::operator<<((ostream *)&cmCTestLog_msg,"    ");
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x632,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet
                                );
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                  }
                  break;
                }
                sourceFile._M_dataplus._M_p = (pointer)&sourceFile.field_2;
                sourceFile._M_string_length = 0;
                sourceFile.field_2._M_local_buf[0] = '\0';
                lcovFile._M_dataplus._M_p = (pointer)&lcovFile.field_2;
                lcovFile._M_string_length = 0;
                lcovFile.field_2._M_local_buf[0] = '\0';
                cmsys::Glob::Glob(&gl);
                dir._M_dataplus._M_p = (pointer)&dir.field_2;
                dir._M_string_length = 0;
                gl.Recurse = true;
                gl.RecurseThroughSymlinks = false;
                dir.field_2._M_local_buf[0] = '\0';
                lcovFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                lcovFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                lcovFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                cmCTest::GetBinaryDir_abi_cxx11_
                          ((string *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
                std::__cxx11::string::operator=((string *)&dir,(string *)&cmCTestLog_msg);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg);
                daGlob._M_dataplus._M_p = (pointer)&daGlob.field_2;
                daGlob._M_string_length = 0;
                daGlob.field_2._M_local_buf[0] = '\0';
                _cmCTestLog_msg = (pointer)dir._M_string_length;
                _cmCTestLog_msg_15 = (char *)0x7;
                cmStrCat<>((string *)&cmCTestLog_msg_21,(cmAlphaNum *)&cmCTestLog_msg,
                           (cmAlphaNum *)&cmCTestLog_msg_15);
                std::__cxx11::string::operator=((string *)&daGlob,(string *)&cmCTestLog_msg_21);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,
                                          "   looking for LCOV files in: ");
                poVar10 = std::operator<<(poVar10,(string *)&daGlob);
                std::endl<char,std::char_traits<char>>(poVar10);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5c3,_cmCTestLog_msg_15,(this->super_cmCTestGenericHandler).Quiet);
                std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
                r = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
                ::cm::
                append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                          (&lcovFiles,r);
                pbVar2 = lcovFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pbVar5 = lcovFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                do {
                  pbVar13 = pbVar5;
                  if (pbVar13 == pbVar2) {
                    iVar8 = 0;
                    goto LAB_001799ef;
                  }
                  std::__cxx11::string::_M_assign((string *)&lcovFile);
                  std::ifstream::ifstream(&cmCTestLog_msg,lcovFile._M_dataplus._M_p,_S_in);
                  if ((abStack_7b8[*(long *)(_cmCTestLog_msg + -0x18)] & 5) != 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_15);
                    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_15,"Cannot open file: ");
                    poVar10 = std::operator<<(poVar10,(string *)&lcovFile);
                    std::endl<char,std::char_traits<char>>(poVar10);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5cd,_cmCTestLog_msg_21,false);
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_15)
                    ;
                  }
                  srcname._M_dataplus._M_p = (pointer)&srcname.field_2;
                  srcname._M_string_length = 0;
                  srcname.field_2._M_local_buf[0] = '\0';
                  bVar6 = cmsys::SystemTools::GetLineFromStream
                                    ((istream *)&cmCTestLog_msg,&srcname,(bool *)0x0,
                                     0xffffffffffffffff);
                  if (bVar6) {
                    std::__cxx11::string::substr((ulong)&cmCTestLog_msg_15,(ulong)&srcname);
                    std::__cxx11::string::operator=((string *)&srcname,(string *)&cmCTestLog_msg_15)
                    ;
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
                    std::__cxx11::string::_M_assign((string *)&sourceFile);
                    std::__cxx11::string::_M_assign((string *)&actualSourceFile);
                    pbVar5 = lcovFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    for (pbVar18 = lcovFiles.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar5;
                        pbVar18 = pbVar18 + 1) {
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)&cmCTestLog_msg_15);
                      poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_15,"Found LCOV File: ");
                      poVar10 = std::operator<<(poVar10,(string *)pbVar18);
                      std::endl<char,std::char_traits<char>>(poVar10);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5e2,_cmCTestLog_msg_21,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                      std::__cxx11::ostringstream::~ostringstream
                                ((ostringstream *)&cmCTestLog_msg_15);
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_15);
                    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_15,"SourceFile: ");
                    poVar10 = std::operator<<(poVar10,(string *)&sourceFile);
                    std::endl<char,std::char_traits<char>>(poVar10);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5e6,_cmCTestLog_msg_21,(this->super_cmCTestGenericHandler).Quiet
                                );
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_15)
                    ;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_15);
                    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_15,"lCovFile: ");
                    poVar10 = std::operator<<(poVar10,(string *)&lcovFile);
                    std::endl<char,std::char_traits<char>>(poVar10);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5e8,_cmCTestLog_msg_21,(this->super_cmCTestGenericHandler).Quiet
                                );
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_15)
                    ;
                    if ((lcovFile._M_string_length != 0) && (actualSourceFile._M_string_length != 0)
                       ) {
                      this_00 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                ::operator[](&cont->TotalCoverage,&actualSourceFile);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)&cmCTestLog_msg_15);
                      poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_15,"   in lcovFile: ");
                      poVar10 = std::operator<<(poVar10,(string *)&lcovFile);
                      std::endl<char,std::char_traits<char>>(poVar10);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5f1,_cmCTestLog_msg_21,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                      std::__cxx11::ostringstream::~ostringstream
                                ((ostringstream *)&cmCTestLog_msg_15);
                      std::ifstream::ifstream
                                ((cmAlphaNum *)&cmCTestLog_msg_15,lcovFile._M_dataplus._M_p,_S_in);
                      if ((abStack_548[*(long *)(_cmCTestLog_msg_15 + -0x18)] & 5) == 0) {
                        nl._M_dataplus._M_p = (pointer)&nl.field_2;
                        nl._M_string_length = 0;
                        nl.field_2._M_local_buf[0] = '\0';
                        cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&cmCTestLog_msg_15,&nl,(bool *)0x0,0xffffffffffffffff)
                        ;
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)&cmCTestLog_msg_21);
                        poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_21,
                                                  "File is ready, start reading.");
                        std::endl<char,std::char_traits<char>>(poVar10);
                        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar1,5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5fe,lineNumber._M_dataplus._M_p,
                                     (this->super_cmCTestGenericHandler).Quiet);
                        std::__cxx11::string::~string((string *)&lineNumber);
                        std::__cxx11::ostringstream::~ostringstream
                                  ((ostringstream *)&cmCTestLog_msg_21);
                        while (bVar7 = cmsys::SystemTools::GetLineFromStream
                                                 ((istream *)&cmCTestLog_msg_15,&nl,(bool *)0x0,
                                                  0xffffffffffffffff), bVar7) {
                          if (0xb < nl._M_string_length) {
                            std::__cxx11::string::substr((ulong)&cmCTestLog_msg_21,(ulong)&nl);
                            iVar8 = atoi(_cmCTestLog_msg_21);
                            std::__cxx11::string::substr((ulong)&lineNumber,(ulong)&nl);
                            iVar9 = atoi(lineNumber._M_dataplus._M_p);
                            if (0 < iVar9) {
                              uVar17 = (ulong)(iVar9 - 1);
                              while (piVar15 = (this_00->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)(this_00->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar15 >> 2) <= uVar17) {
                                local_9fc = -1;
                                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                                          (this_00,&local_9fc);
                              }
                              iVar9 = piVar15[uVar17];
                              if (iVar9 < 0) {
                                if (iVar8 < 1) {
                                  lVar14 = std::__cxx11::string::find
                                                     ((char)(string *)&cmCTestLog_msg_21,0x23);
                                  piVar15 = (this_00->super__Vector_base<int,_std::allocator<int>_>)
                                            ._M_impl.super__Vector_impl_data._M_start;
                                  if (lVar14 == -1) {
                                    iVar9 = piVar15[uVar17];
                                    goto LAB_0017996b;
                                  }
                                }
                                piVar15[uVar17] = 0;
                                iVar9 = 0;
                              }
LAB_0017996b:
                              piVar15[uVar17] = iVar9 + iVar8;
                            }
                            std::__cxx11::string::~string((string *)&lineNumber);
                            std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                          }
                        }
                        std::__cxx11::string::~string((string *)&nl);
                      }
                      else {
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)&cmCTestLog_msg_21);
                        poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_21,"Cannot open file: "
                                                 );
                        poVar10 = std::operator<<(poVar10,(string *)&lcovFile);
                        std::endl<char,std::char_traits<char>>(poVar10);
                        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::stringbuf::str();
                        cmCTest::Log(pcVar1,7,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5f6,nl._M_dataplus._M_p,false);
                        std::__cxx11::string::~string((string *)&nl);
                        std::__cxx11::ostringstream::~ostringstream
                                  ((ostringstream *)&cmCTestLog_msg_21);
                      }
                      actualSourceFile._M_string_length = 0;
                      *actualSourceFile._M_dataplus._M_p = '\0';
                      std::ifstream::~ifstream((cmAlphaNum *)&cmCTestLog_msg_15);
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_15);
                    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg_15,
                                              "Error while parsing lcov file \'");
                    poVar10 = std::operator<<(poVar10,(string *)&lcovFile);
                    poVar10 = std::operator<<(poVar10,"\':");
                    poVar10 = std::operator<<(poVar10," No source file name found!");
                    std::endl<char,std::char_traits<char>>(poVar10);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5d6,_cmCTestLog_msg_21,false);
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_21);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_15)
                    ;
                  }
                  std::__cxx11::string::~string((string *)&srcname);
                  std::ifstream::~ifstream(&cmCTestLog_msg);
                  pbVar5 = pbVar13 + 1;
                } while (bVar6);
                iVar8 = 1;
LAB_001799ef:
                std::__cxx11::string::~string((string *)&daGlob);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&lcovFiles);
                std::__cxx11::string::~string((string *)&dir);
                cmsys::Glob::~Glob(&gl);
                std::__cxx11::string::~string((string *)&lcovFile);
                std::__cxx11::string::~string((string *)&sourceFile);
                pbVar12 = pbVar12 + 1;
              } while (pbVar13 == pbVar2);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&lines);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              psVar19 = local_a08;
              poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,
                                        "Problem running coverage on file: ");
              poVar10 = std::operator<<(poVar10,(string *)psVar19);
              std::endl<char,std::char_traits<char>>(poVar10);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x596,_cmCTestLog_msg_15,false);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Command produced error: ");
              poVar10 = std::operator<<(poVar10,(string *)&errors);
              std::endl<char,std::char_traits<char>>(poVar10);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x598,_cmCTestLog_msg_15,false);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              cont->Error = cont->Error + 1;
              iVar8 = 0x11;
            }
            std::__cxx11::string::~string((string *)&errors);
            std::__cxx11::string::~string((string *)&output);
            cmWorkingDirectory::~cmWorkingDirectory(&workdir);
            std::__cxx11::string::~string((string *)&fileDir);
            psVar19 = local_a08;
            if ((iVar8 != 0x11) && (iVar8 != 0)) {
              iVar16 = 0;
              break;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,
                                      "Unable to change working directory to ");
            poVar10 = std::operator<<(poVar10,(string *)&fileDir);
            poVar10 = std::operator<<(poVar10," : ");
            pcVar11 = strerror(workdir.ResultCode);
            poVar10 = std::operator<<(poVar10,pcVar11);
            std::endl<char,std::char_traits<char>>(poVar10);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x57e,_cmCTestLog_msg_15,false);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            cont->Error = cont->Error + 1;
            cmWorkingDirectory::~cmWorkingDirectory(&workdir);
            std::__cxx11::string::~string((string *)&fileDir);
          }
        }
        std::__cxx11::string::~string((string *)&command);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&covargs);
        cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&locale_C);
        std::__cxx11::string::~string((string *)&actualSourceFile);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&missingFiles._M_t);
        std::__cxx11::string::~string((string *)&testingDir);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,"Error while finding LCov files.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      iVar16 = 0;
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x553,_cmCTestLog_msg_15,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_15);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    cmsys::RegularExpression::~RegularExpression(&st2re3);
    std::__cxx11::string::~string((string *)&st2lcovOutputRex3);
  }
  std::__cxx11::string::~string((string *)&lcovExtraFlags);
  std::__cxx11::string::~string((string *)&lcovCommand);
  return iVar16;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  std::vector<std::string> covargs =
    cmSystemTools::ParseArguments(lcovExtraFlags);
  covargs.insert(covargs.begin(), lcovCommand);
  const std::string command = joinCommandLine(covargs);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (std::string const& f : files) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(f);
    cmWorkingDirectory workdir(fileDir);
    if (workdir.Failed()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to change working directory to "
                   << fileDir << " : "
                   << std::strerror(workdir.GetLastResult()) << std::endl);
      cont->Error++;
      continue;
    }

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(covargs, &output, &errors, &retVal,
                                      fileDir.c_str(),
                                      cmDuration::zero() /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Coverage command returned: "
                   << retVal << " while processing: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    cmsys::SystemTools::Split(output, lines);

    for (std::string const& line : lines) {
      std::string sourceFile;
      std::string lcovFile;

      if (line.empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = cmStrCat(dir, "/*.LCOV");
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      cm::append(lcovFiles, gl.GetFiles());

      for (std::string const& file : lcovFiles) {
        lcovFile = file;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::string const& t : lcovFiles) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile.clear();
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}